

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetTextHeight(ON_Annotation *this,ON_DimStyle *parent_style,double height)

{
  bool bCreateIfNull;
  ON_DimStyle *pOVar1;
  double candidate_value;
  ON_DimStyle *override_style;
  bool bCreate;
  double height_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  candidate_value = ON_DimStyle::TextHeight(pOVar1);
  bCreateIfNull = Internal_DimStyleDoubleChanged(height,candidate_value);
  pOVar1 = Internal_GetOverrideStyle(this,bCreateIfNull);
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetTextHeight(pOVar1,height);
    ON_DimStyle::SetFieldOverride(pOVar1,TextHeight,bCreateIfNull);
  }
  return;
}

Assistant:

void ON_Annotation::SetTextHeight(const ON_DimStyle* parent_style, double height)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(height, parent_style->TextHeight());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetTextHeight(height);
    override_style->SetFieldOverride(ON_DimStyle::field::TextHeight, bCreate);
  }
}